

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ColorEqual
          (ShaderImageLoadStoreBase *this,vec4 *c0,vec4 *c1,vec4 *epsilon)

{
  float fVar1;
  float *pfVar2;
  double dVar3;
  vec4 *epsilon_local;
  vec4 *c1_local;
  vec4 *c0_local;
  ShaderImageLoadStoreBase *this_local;
  
  pfVar2 = tcu::Vector<float,_4>::operator[](c0,0);
  fVar1 = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::operator[](c1,0);
  dVar3 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar2));
  pfVar2 = tcu::Vector<float,_4>::operator[](epsilon,0);
  if (SUB84(dVar3,0) < *pfVar2 || SUB84(dVar3,0) == *pfVar2) {
    pfVar2 = tcu::Vector<float,_4>::operator[](c0,1);
    fVar1 = *pfVar2;
    pfVar2 = tcu::Vector<float,_4>::operator[](c1,1);
    dVar3 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar2));
    pfVar2 = tcu::Vector<float,_4>::operator[](epsilon,1);
    if (SUB84(dVar3,0) < *pfVar2 || SUB84(dVar3,0) == *pfVar2) {
      pfVar2 = tcu::Vector<float,_4>::operator[](c0,2);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_4>::operator[](c1,2);
      dVar3 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar2));
      pfVar2 = tcu::Vector<float,_4>::operator[](epsilon,2);
      if (SUB84(dVar3,0) < *pfVar2 || SUB84(dVar3,0) == *pfVar2) {
        pfVar2 = tcu::Vector<float,_4>::operator[](c0,3);
        fVar1 = *pfVar2;
        pfVar2 = tcu::Vector<float,_4>::operator[](c1,3);
        dVar3 = std::fabs((double)(ulong)(uint)(fVar1 - *pfVar2));
        pfVar2 = tcu::Vector<float,_4>::operator[](epsilon,3);
        if (SUB84(dVar3,0) < *pfVar2 || SUB84(dVar3,0) == *pfVar2) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool ColorEqual(const vec4& c0, const vec4& c1, const vec4& epsilon)
	{
		if (fabs(c0[0] - c1[0]) > epsilon[0])
			return false;
		if (fabs(c0[1] - c1[1]) > epsilon[1])
			return false;
		if (fabs(c0[2] - c1[2]) > epsilon[2])
			return false;
		if (fabs(c0[3] - c1[3]) > epsilon[3])
			return false;
		return true;
	}